

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O3

void io::save<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *data,string *file_name)

{
  char cVar1;
  pointer pvVar2;
  ostream *poVar3;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x10;
    pvVar2 = (data->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((data->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
      uVar6 = 0;
      do {
        pdVar4 = pvVar2[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pvVar2[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar4) {
          uVar7 = 1;
          uVar5 = 0;
          do {
            std::ostream::_M_insert<double>(pdVar4[uVar5]);
            pvVar2 = (data->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (((long)*(pointer *)
                        ((long)&pvVar2[uVar5].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&pvVar2[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data >> 3) - 1U != uVar5) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
              pvVar2 = (data->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            }
            uVar5 = (ulong)uVar7;
            pdVar4 = pvVar2[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar7 = uVar7 + 1;
          } while (uVar5 < (ulong)((long)*(pointer *)
                                          ((long)&pvVar2[uVar6].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)pdVar4 >> 3));
        }
        cVar1 = (char)(ostream *)&local_230;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        uVar6 = (ulong)((int)uVar6 + 1);
        pvVar2 = (data->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(data->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                -0x5555555555555555;
      } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
    }
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file \"",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(file_name->_M_dataplus)._M_p,
                      file_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" not found",0xb);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

void save(std::vector<std::vector<T> > const& data, std::string file_name) {
        std::ofstream file;
        file.open(file_name.c_str());
        if(!file.is_open())
        {
            std::cout << "file \"" << file_name << "\" not found" << std::endl;
            exit(1);
        }

        file.precision(std::numeric_limits<T>::digits10 + 1);
        for(unsigned int i = 0; i < data.size(); i++)
        {
            for(unsigned int j = 0; j < data[i].size(); j++)
            {
                file << data[i][j];
                if (j != data[j].size() - 1)
                    file << " ";
            }
            file << std::endl;
        }
        file.close();
    }